

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O3

void aom_lpf_vertical_4_quad_sse2
               (uint8_t *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  unkbyte10 Var23;
  undefined1 auVar24 [12];
  unkbyte10 Var25;
  undefined1 auVar26 [12];
  unkbyte10 Var27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [14];
  undefined1 auVar32 [12];
  undefined1 auVar33 [14];
  undefined1 auVar34 [12];
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  unkbyte10 Var39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [14];
  ulong uVar43;
  undefined1 auVar44 [12];
  undefined1 auVar45 [16];
  unkbyte10 Var46;
  undefined1 auVar47 [12];
  long lVar48;
  long lVar49;
  undefined4 uVar50;
  undefined6 uVar51;
  undefined1 auVar53 [12];
  undefined1 auVar57 [16];
  undefined4 uVar67;
  undefined1 auVar69 [12];
  undefined8 uVar68;
  undefined1 uVar88;
  undefined1 uVar89;
  undefined1 uVar90;
  undefined1 uVar92;
  undefined1 uVar93;
  undefined1 auVar71 [16];
  undefined1 auVar80 [16];
  undefined2 uVar94;
  undefined4 uVar95;
  undefined1 auVar97 [12];
  undefined1 auVar101 [16];
  undefined1 auVar110 [16];
  undefined1 auVar116 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar129 [16];
  undefined1 auVar134 [16];
  undefined1 auVar141 [16];
  undefined2 uVar146;
  undefined1 auVar150 [12];
  undefined1 uVar163;
  undefined1 uVar165;
  undefined1 uVar166;
  undefined1 auVar153 [16];
  undefined2 uVar168;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar185 [16];
  undefined1 auVar192 [16];
  undefined1 uVar205;
  undefined1 uVar206;
  undefined1 auVar198 [16];
  undefined1 auVar208 [12];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar221 [16];
  undefined1 uVar227;
  undefined1 auVar224 [16];
  uchar t_dst [128];
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined8 uVar52;
  undefined1 auVar55 [12];
  undefined1 auVar54 [12];
  undefined1 auVar64 [16];
  undefined1 auVar56 [14];
  undefined1 auVar66 [16];
  undefined1 auVar65 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar70 [12];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar79 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 uVar91;
  undefined6 uVar96;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar99 [12];
  undefined1 auVar98 [12];
  undefined1 auVar109 [16];
  undefined1 auVar100 [14];
  undefined1 auVar112 [16];
  undefined1 auVar111 [16];
  undefined1 uVar113;
  undefined1 uVar114;
  undefined1 uVar115;
  undefined1 auVar130 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar131 [16];
  undefined1 auVar125 [16];
  undefined1 auVar132 [16];
  undefined1 auVar126 [16];
  undefined1 auVar133 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 uVar144;
  undefined1 uVar145;
  undefined4 uVar147;
  undefined6 uVar148;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined8 uVar149;
  undefined1 auVar151 [12];
  undefined1 auVar161 [16];
  undefined1 auVar152 [14];
  undefined1 auVar162 [16];
  undefined1 uVar164;
  undefined1 uVar167;
  undefined4 uVar169;
  undefined6 uVar170;
  undefined8 uVar171;
  undefined1 auVar172 [12];
  undefined1 auVar176 [16];
  undefined1 auVar173 [14];
  undefined1 auVar177 [16];
  undefined1 auVar174 [16];
  undefined1 auVar193 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar194 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar195 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar196 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 uVar197;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 uVar207;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar210 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar211 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  
  lVar49 = (long)pitch;
  lVar48 = lVar49 * 8 + -4;
  uVar1 = *(ulong *)(s + -4);
  uVar68 = *(undefined8 *)(s + lVar49 + -4);
  auVar63._8_6_ = 0;
  auVar63._0_8_ = uVar1;
  auVar63[0xe] = (char)(uVar1 >> 0x38);
  auVar63[0xf] = (char)((ulong)uVar68 >> 0x38);
  auVar62._14_2_ = auVar63._14_2_;
  auVar62._8_5_ = 0;
  auVar62._0_8_ = uVar1;
  auVar62[0xd] = (char)((ulong)uVar68 >> 0x30);
  auVar61._13_3_ = auVar62._13_3_;
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar1;
  auVar61[0xc] = (char)(uVar1 >> 0x30);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_3_ = 0;
  auVar60._0_8_ = uVar1;
  auVar60[0xb] = (char)((ulong)uVar68 >> 0x28);
  auVar59._11_5_ = auVar60._11_5_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar1;
  auVar59[10] = (char)(uVar1 >> 0x28);
  auVar58._10_6_ = auVar59._10_6_;
  auVar58[8] = 0;
  auVar58._0_8_ = uVar1;
  auVar58[9] = (char)((ulong)uVar68 >> 0x20);
  auVar57._9_7_ = auVar58._9_7_;
  auVar57[8] = (char)(uVar1 >> 0x20);
  auVar57._0_8_ = uVar1;
  uVar2 = *(ulong *)(s + lVar49 * 2 + -4);
  lVar13 = lVar49 * 3;
  uVar149 = *(undefined8 *)(s + lVar13 + -4);
  auVar122._8_6_ = 0;
  auVar122._0_8_ = uVar2;
  auVar122[0xe] = (char)(uVar2 >> 0x38);
  auVar122[0xf] = (char)((ulong)uVar149 >> 0x38);
  auVar121._14_2_ = auVar122._14_2_;
  auVar121._8_5_ = 0;
  auVar121._0_8_ = uVar2;
  auVar121[0xd] = (char)((ulong)uVar149 >> 0x30);
  auVar120._13_3_ = auVar121._13_3_;
  auVar120._8_4_ = 0;
  auVar120._0_8_ = uVar2;
  auVar120[0xc] = (char)(uVar2 >> 0x30);
  auVar119._12_4_ = auVar120._12_4_;
  auVar119._8_3_ = 0;
  auVar119._0_8_ = uVar2;
  auVar119[0xb] = (char)((ulong)uVar149 >> 0x28);
  auVar118._11_5_ = auVar119._11_5_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar2;
  auVar118[10] = (char)(uVar2 >> 0x28);
  auVar117._10_6_ = auVar118._10_6_;
  auVar117[8] = 0;
  auVar117._0_8_ = uVar2;
  auVar117[9] = (char)((ulong)uVar149 >> 0x20);
  auVar116._9_7_ = auVar117._9_7_;
  auVar116[8] = (char)(uVar2 >> 0x20);
  auVar116._0_8_ = uVar2;
  uVar3 = *(ulong *)(s + lVar49 * 4 + -4);
  lVar14 = lVar49 * 5;
  uVar52 = *(undefined8 *)(s + lVar14 + -4);
  auVar108._8_6_ = 0;
  auVar108._0_8_ = uVar3;
  auVar108[0xe] = (char)(uVar3 >> 0x38);
  auVar108[0xf] = (char)((ulong)uVar52 >> 0x38);
  auVar107._14_2_ = auVar108._14_2_;
  auVar107._8_5_ = 0;
  auVar107._0_8_ = uVar3;
  auVar107[0xd] = (char)((ulong)uVar52 >> 0x30);
  auVar106._13_3_ = auVar107._13_3_;
  auVar106._8_4_ = 0;
  auVar106._0_8_ = uVar3;
  auVar106[0xc] = (char)(uVar3 >> 0x30);
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._8_3_ = 0;
  auVar105._0_8_ = uVar3;
  auVar105[0xb] = (char)((ulong)uVar52 >> 0x28);
  auVar104._11_5_ = auVar105._11_5_;
  auVar104._8_2_ = 0;
  auVar104._0_8_ = uVar3;
  auVar104[10] = (char)(uVar3 >> 0x28);
  auVar103._10_6_ = auVar104._10_6_;
  auVar103[8] = 0;
  auVar103._0_8_ = uVar3;
  auVar103[9] = (char)((ulong)uVar52 >> 0x20);
  auVar102._9_7_ = auVar103._9_7_;
  auVar102[8] = (char)(uVar3 >> 0x20);
  auVar102._0_8_ = uVar3;
  uVar92 = (undefined1)((ulong)uVar52 >> 0x18);
  uVar115 = (undefined1)(uVar3 >> 0x18);
  Var23 = CONCAT91(CONCAT81(auVar102._8_8_,uVar92),uVar115);
  uVar89 = (undefined1)((ulong)uVar52 >> 0x10);
  auVar22._2_10_ = Var23;
  auVar22[1] = uVar89;
  uVar114 = (undefined1)(uVar3 >> 0x10);
  auVar22[0] = uVar114;
  uVar88 = (undefined1)((ulong)uVar52 >> 8);
  auVar101._2_12_ = auVar22;
  auVar101[1] = uVar88;
  uVar113 = (undefined1)(uVar3 >> 8);
  auVar101[0] = uVar113;
  auVar101._14_2_ = 0;
  auVar101 = auVar101 << 0x10;
  lVar16 = lVar49 * 6;
  uVar4 = *(ulong *)(s + lVar16 + -4);
  lVar15 = lVar49 * 7;
  uVar171 = *(undefined8 *)(s + lVar15 + -4);
  auVar140._8_6_ = 0;
  auVar140._0_8_ = uVar4;
  auVar140[0xe] = (char)(uVar4 >> 0x38);
  auVar140[0xf] = (char)((ulong)uVar171 >> 0x38);
  auVar139._14_2_ = auVar140._14_2_;
  auVar139._8_5_ = 0;
  auVar139._0_8_ = uVar4;
  auVar139[0xd] = (char)((ulong)uVar171 >> 0x30);
  auVar138._13_3_ = auVar139._13_3_;
  auVar138._8_4_ = 0;
  auVar138._0_8_ = uVar4;
  auVar138[0xc] = (char)(uVar4 >> 0x30);
  auVar137._12_4_ = auVar138._12_4_;
  auVar137._8_3_ = 0;
  auVar137._0_8_ = uVar4;
  auVar137[0xb] = (char)((ulong)uVar171 >> 0x28);
  auVar136._11_5_ = auVar137._11_5_;
  auVar136._8_2_ = 0;
  auVar136._0_8_ = uVar4;
  auVar136[10] = (char)(uVar4 >> 0x28);
  auVar135._10_6_ = auVar136._10_6_;
  auVar135[8] = 0;
  auVar135._0_8_ = uVar4;
  auVar135[9] = (char)((ulong)uVar171 >> 0x20);
  auVar134._9_7_ = auVar135._9_7_;
  auVar134[8] = (char)(uVar4 >> 0x20);
  auVar134._0_8_ = uVar4;
  uVar93 = (undefined1)((ulong)uVar171 >> 0x18);
  uVar145 = (undefined1)(uVar4 >> 0x18);
  Var25 = CONCAT91(CONCAT81(auVar134._8_8_,uVar93),uVar145);
  uVar90 = (undefined1)((ulong)uVar171 >> 0x10);
  auVar24._2_10_ = Var25;
  auVar24[1] = uVar90;
  uVar144 = (undefined1)(uVar4 >> 0x10);
  auVar24[0] = uVar144;
  uVar94 = CONCAT11((char)uVar171,(char)uVar4);
  uVar5 = *(ulong *)(s + lVar49 * 8 + -4);
  uVar6 = *(undefined8 *)(s + lVar49 + lVar48);
  auVar78._8_6_ = 0;
  auVar78._0_8_ = uVar5;
  auVar78[0xe] = (char)(uVar5 >> 0x38);
  auVar78[0xf] = (char)((ulong)uVar6 >> 0x38);
  auVar77._14_2_ = auVar78._14_2_;
  auVar77._8_5_ = 0;
  auVar77._0_8_ = uVar5;
  auVar77[0xd] = (char)((ulong)uVar6 >> 0x30);
  auVar76._13_3_ = auVar77._13_3_;
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar5;
  auVar76[0xc] = (char)(uVar5 >> 0x30);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_3_ = 0;
  auVar75._0_8_ = uVar5;
  auVar75[0xb] = (char)((ulong)uVar6 >> 0x28);
  auVar74._11_5_ = auVar75._11_5_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar5;
  auVar74[10] = (char)(uVar5 >> 0x28);
  auVar73._10_6_ = auVar74._10_6_;
  auVar73[8] = 0;
  auVar73._0_8_ = uVar5;
  auVar73[9] = (char)((ulong)uVar6 >> 0x20);
  auVar72._9_7_ = auVar73._9_7_;
  auVar72[8] = (char)(uVar5 >> 0x20);
  auVar72._0_8_ = uVar5;
  Var27 = CONCAT91(CONCAT81(auVar72._8_8_,(char)((ulong)uVar6 >> 0x18)),(char)(uVar5 >> 0x18));
  uVar165 = (undefined1)((ulong)uVar6 >> 0x10);
  auVar26._2_10_ = Var27;
  auVar26[1] = uVar165;
  uVar91 = (undefined1)(uVar5 >> 0x10);
  auVar26[0] = uVar91;
  uVar163 = (undefined1)((ulong)uVar6 >> 8);
  auVar42._1_12_ = auVar26;
  auVar42[0] = uVar163;
  auVar42[0xd] = 0;
  auVar71._0_2_ = CONCAT11((char)uVar6,(char)uVar5);
  auVar71._2_14_ = auVar42 << 8;
  auVar211._0_12_ = auVar101._0_12_;
  auVar211._12_2_ = (short)Var23;
  auVar211._14_2_ = (short)Var25;
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._0_10_ = auVar101._0_10_;
  auVar210._10_2_ = auVar24._0_2_;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._0_8_ = auVar101._0_8_;
  auVar209._8_2_ = auVar22._0_2_;
  uVar7 = *(ulong *)(s + lVar49 * 2 + lVar48);
  uVar8 = *(undefined8 *)(s + lVar13 + lVar48);
  auVar184._8_6_ = 0;
  auVar184._0_8_ = uVar7;
  auVar184[0xe] = (char)(uVar7 >> 0x38);
  auVar184[0xf] = (char)((ulong)uVar8 >> 0x38);
  auVar183._14_2_ = auVar184._14_2_;
  auVar183._8_5_ = 0;
  auVar183._0_8_ = uVar7;
  auVar183[0xd] = (char)((ulong)uVar8 >> 0x30);
  auVar182._13_3_ = auVar183._13_3_;
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar7;
  auVar182[0xc] = (char)(uVar7 >> 0x30);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_3_ = 0;
  auVar181._0_8_ = uVar7;
  auVar181[0xb] = (char)((ulong)uVar8 >> 0x28);
  auVar180._11_5_ = auVar181._11_5_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar7;
  auVar180[10] = (char)(uVar7 >> 0x28);
  auVar179._10_6_ = auVar180._10_6_;
  auVar179[8] = 0;
  auVar179._0_8_ = uVar7;
  auVar179[9] = (char)((ulong)uVar8 >> 0x20);
  auVar178._9_7_ = auVar179._9_7_;
  auVar178[8] = (char)(uVar7 >> 0x20);
  auVar178._0_8_ = uVar7;
  Var23 = CONCAT91(CONCAT81(auVar178._8_8_,(char)((ulong)uVar8 >> 0x18)),(char)(uVar7 >> 0x18));
  uVar166 = (undefined1)((ulong)uVar8 >> 0x10);
  auVar28._2_10_ = Var23;
  auVar28[1] = uVar166;
  uVar197 = (undefined1)(uVar7 >> 0x10);
  auVar28[0] = uVar197;
  auVar17[5] = (char)uVar8;
  auVar17[4] = (char)uVar7;
  uVar9 = *(ulong *)(s + lVar49 * 4 + lVar48);
  uVar10 = *(undefined8 *)(s + lVar14 + lVar48);
  auVar160._8_6_ = 0;
  auVar160._0_8_ = uVar9;
  auVar160[0xe] = (char)(uVar9 >> 0x38);
  auVar160[0xf] = (char)((ulong)uVar10 >> 0x38);
  auVar159._14_2_ = auVar160._14_2_;
  auVar159._8_5_ = 0;
  auVar159._0_8_ = uVar9;
  auVar159[0xd] = (char)((ulong)uVar10 >> 0x30);
  auVar158._13_3_ = auVar159._13_3_;
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar9;
  auVar158[0xc] = (char)(uVar9 >> 0x30);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_3_ = 0;
  auVar157._0_8_ = uVar9;
  auVar157[0xb] = (char)((ulong)uVar10 >> 0x28);
  auVar156._11_5_ = auVar157._11_5_;
  auVar156._8_2_ = 0;
  auVar156._0_8_ = uVar9;
  auVar156[10] = (char)(uVar9 >> 0x28);
  auVar155._10_6_ = auVar156._10_6_;
  auVar155[8] = 0;
  auVar155._0_8_ = uVar9;
  auVar155[9] = (char)((ulong)uVar10 >> 0x20);
  auVar154._9_7_ = auVar155._9_7_;
  auVar154[8] = (char)(uVar9 >> 0x20);
  auVar154._0_8_ = uVar9;
  Var25 = CONCAT91(CONCAT81(auVar154._8_8_,(char)((ulong)uVar10 >> 0x18)),(char)(uVar9 >> 0x18));
  uVar206 = (undefined1)((ulong)uVar10 >> 0x10);
  auVar29._2_10_ = Var25;
  auVar29[1] = uVar206;
  uVar167 = (undefined1)(uVar9 >> 0x10);
  auVar29[0] = uVar167;
  uVar205 = (undefined1)((ulong)uVar10 >> 8);
  auVar153._4_12_ = auVar29;
  auVar153[3] = uVar205;
  uVar164 = (undefined1)(uVar9 >> 8);
  auVar153[2] = uVar164;
  auVar153._0_2_ = CONCAT11((char)uVar10,(char)uVar9);
  auVar223._0_12_ = auVar71._0_12_;
  auVar223._12_2_ = (short)Var27;
  auVar223._14_2_ = (short)Var23;
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._0_10_ = auVar71._0_10_;
  auVar222._10_2_ = auVar28._0_2_;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._0_8_ = auVar71._0_8_;
  auVar221._8_2_ = auVar26._0_2_;
  auVar17._2_2_ = auVar71._0_2_;
  uVar11 = *(ulong *)(s + lVar16 + lVar48);
  uVar12 = *(undefined8 *)(s + lVar15 + lVar48);
  auVar204._8_6_ = 0;
  auVar204._0_8_ = uVar11;
  auVar204[0xe] = (char)(uVar11 >> 0x38);
  auVar204[0xf] = (char)((ulong)uVar12 >> 0x38);
  auVar203._14_2_ = auVar204._14_2_;
  auVar203._8_5_ = 0;
  auVar203._0_8_ = uVar11;
  auVar203[0xd] = (char)((ulong)uVar12 >> 0x30);
  auVar202._13_3_ = auVar203._13_3_;
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar11;
  auVar202[0xc] = (char)(uVar11 >> 0x30);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_3_ = 0;
  auVar201._0_8_ = uVar11;
  auVar201[0xb] = (char)((ulong)uVar12 >> 0x28);
  auVar200._11_5_ = auVar201._11_5_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar11;
  auVar200[10] = (char)(uVar11 >> 0x28);
  auVar199._10_6_ = auVar200._10_6_;
  auVar199[8] = 0;
  auVar199._0_8_ = uVar11;
  auVar199[9] = (char)((ulong)uVar12 >> 0x20);
  auVar198._9_7_ = auVar199._9_7_;
  auVar198[8] = (char)(uVar11 >> 0x20);
  auVar198._0_8_ = uVar11;
  Var23 = CONCAT91(CONCAT81(auVar198._8_8_,(char)((ulong)uVar12 >> 0x18)),(char)(uVar11 >> 0x18));
  uVar227 = (undefined1)((ulong)uVar12 >> 0x10);
  auVar30._2_10_ = Var23;
  auVar30[1] = uVar227;
  uVar207 = (undefined1)(uVar11 >> 0x10);
  auVar30[0] = uVar207;
  auVar17[9] = (char)uVar12;
  auVar17[8] = (char)uVar11;
  auVar226._0_12_ = auVar153._0_12_;
  auVar226._12_2_ = (short)Var25;
  auVar226._14_2_ = (short)Var23;
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._0_10_ = auVar153._0_10_;
  auVar225._10_2_ = auVar30._0_2_;
  auVar224._10_6_ = auVar225._10_6_;
  auVar224._0_8_ = auVar153._0_8_;
  auVar224._8_2_ = auVar29._0_2_;
  auVar17._6_2_ = auVar153._0_2_;
  local_78 = CONCAT22(auVar116._8_2_,auVar57._8_2_);
  auVar53._0_8_ = CONCAT26(auVar118._10_2_,CONCAT24(auVar59._10_2_,local_78));
  auVar53._8_2_ = auVar61._12_2_;
  auVar53._10_2_ = auVar120._12_2_;
  auVar64._12_2_ = auVar62._14_2_;
  auVar64._0_12_ = auVar53;
  auVar64._14_2_ = auVar121._14_2_;
  uStack_74 = CONCAT22(auVar134._8_2_,auVar102._8_2_);
  auVar97._0_8_ = CONCAT26(auVar136._10_2_,CONCAT24(auVar104._10_2_,uStack_74));
  auVar97._8_2_ = auVar106._12_2_;
  auVar97._10_2_ = auVar138._12_2_;
  auVar109._12_2_ = auVar107._14_2_;
  auVar109._0_12_ = auVar97;
  auVar109._14_2_ = auVar139._14_2_;
  uVar50 = CONCAT22(auVar178._8_2_,auVar72._8_2_);
  auVar69._0_8_ = CONCAT26(auVar180._10_2_,CONCAT24(auVar74._10_2_,uVar50));
  auVar69._8_2_ = auVar76._12_2_;
  auVar69._10_2_ = auVar182._12_2_;
  auVar79._12_2_ = auVar77._14_2_;
  auVar79._0_12_ = auVar69;
  auVar79._14_2_ = auVar183._14_2_;
  uVar67 = CONCAT22(auVar198._8_2_,auVar154._8_2_);
  auVar150._0_8_ = CONCAT26(auVar200._10_2_,CONCAT24(auVar156._10_2_,uVar67));
  auVar150._8_2_ = auVar158._12_2_;
  auVar150._10_2_ = auVar202._12_2_;
  auVar161._12_2_ = auVar159._14_2_;
  auVar161._0_12_ = auVar150;
  auVar161._14_2_ = auVar203._14_2_;
  auVar123._8_4_ = (int)((ulong)auVar53._0_8_ >> 0x20);
  auVar123._0_8_ = auVar53._0_8_;
  auVar123._12_4_ = (int)((ulong)auVar97._0_8_ >> 0x20);
  local_68 = auVar123._8_8_;
  local_58 = auVar53._8_4_;
  uStack_54 = auVar97._8_4_;
  uStack_40 = auVar64._12_4_;
  uStack_3c = auVar109._12_4_;
  auVar110._8_4_ = (int)((ulong)auVar69._0_8_ >> 0x20);
  auVar110._0_8_ = auVar69._0_8_;
  auVar110._12_4_ = (int)((ulong)auVar150._0_8_ >> 0x20);
  uStack_60 = auVar110._8_8_;
  uStack_70 = CONCAT44(uVar67,uVar50);
  uStack_50 = auVar69._8_4_;
  uStack_4c = auVar150._8_4_;
  uStack_38 = auVar79._12_4_;
  uStack_34 = auVar161._12_4_;
  aom_lpf_horizontal_4_quad_sse2((uchar *)&local_78,0x10,_blimit0,_limit0,_thresh0);
  auVar17._0_2_ = uVar94;
  auVar17._10_6_ = 0;
  auVar17 = auVar17 << 0x30;
  uVar43 = CONCAT44(auVar221._8_4_,auVar209._8_4_);
  auVar18._8_4_ = 0;
  auVar18._0_8_ = uVar43;
  auVar18 = auVar18 << 0x20;
  auVar45._8_4_ = auVar224._8_4_;
  auVar45._0_8_ = uVar43;
  auVar45._12_4_ = 0;
  auVar19._8_8_ = uStack_70;
  auVar19._0_8_ = CONCAT44(uStack_74,local_78);
  auVar21._8_4_ = uStack_50;
  auVar21._0_8_ = CONCAT44(uStack_54,local_58);
  auVar20._12_4_ = uStack_4c;
  auVar20._0_12_ = auVar21;
  auVar86._0_14_ = auVar17._0_14_;
  auVar86[0xe] = (char)uVar171;
  auVar86[0xf] = (char)((ulong)uVar171 >> 8);
  auVar85._14_2_ = auVar86._14_2_;
  auVar85._0_13_ = auVar17._0_13_;
  auVar85[0xd] = (char)(uVar4 >> 8);
  auVar84._13_3_ = auVar85._13_3_;
  auVar84._0_12_ = auVar17._0_12_;
  auVar84[0xc] = (char)uVar4;
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._0_11_ = auVar17._0_11_;
  auVar83[0xb] = uVar88;
  auVar82._11_5_ = auVar83._11_5_;
  auVar82._0_10_ = auVar17._0_10_;
  auVar82[10] = (char)uVar52;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._0_9_ = auVar17._0_9_;
  auVar81[9] = uVar113;
  Var46 = CONCAT73(auVar81._9_7_,CONCAT12((char)uVar3,uVar94));
  Var23 = CONCAT91(CONCAT81((long)((unkuint10)Var46 >> 0x10),(char)((ulong)uVar149 >> 8)),
                   (char)uVar149);
  auVar32._2_10_ = Var23;
  auVar32[1] = (char)(uVar2 >> 8);
  auVar32[0] = (char)uVar2;
  auVar31._2_12_ = auVar32;
  auVar31[1] = (char)((ulong)uVar68 >> 8);
  auVar31[0] = (char)uVar68;
  auVar80._0_2_ = (undefined2)uVar1;
  auVar80._2_14_ = auVar31;
  uVar50 = CONCAT13(uVar163,CONCAT12((char)uVar6,(short)uVar5));
  uVar51 = CONCAT15((char)(uVar7 >> 8),CONCAT14((char)uVar7,uVar50));
  uVar52 = CONCAT17((char)((ulong)uVar8 >> 8),CONCAT16((char)uVar8,uVar51));
  auVar54._0_10_ = CONCAT19(uVar164,CONCAT18((char)uVar9,uVar52));
  auVar54[10] = (char)uVar10;
  auVar54[0xb] = uVar205;
  auVar56[0xc] = (char)uVar11;
  auVar56._0_12_ = auVar54;
  auVar56[0xd] = (char)(uVar11 >> 8);
  auVar65[0xe] = (char)uVar12;
  auVar65._0_14_ = auVar56;
  auVar65[0xf] = (char)((ulong)uVar12 >> 8);
  auVar128._0_14_ = SUB1614(auVar45 << 0x20,0);
  auVar128[0xe] = uVar90;
  auVar128[0xf] = uStack_81;
  auVar127._14_2_ = auVar128._14_2_;
  auVar127._0_13_ = SUB1613(auVar45 << 0x20,0);
  auVar127[0xd] = uStack_82;
  auVar47[8] = uVar144;
  auVar47._0_8_ = uVar43;
  auVar47._9_3_ = auVar127._13_3_;
  auVar126._12_4_ = auVar47._8_4_;
  auVar126._0_11_ = auVar18._0_11_;
  auVar126[0xb] = uStack_83;
  auVar125._11_5_ = auVar126._11_5_;
  auVar125._0_10_ = auVar18._0_10_;
  auVar125[10] = uVar89;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._0_9_ = auVar18._0_9_;
  auVar124[9] = uStack_84;
  auVar44[4] = uVar114;
  auVar44._0_4_ = auVar209._8_4_;
  auVar44._5_7_ = auVar124._9_7_;
  Var25 = CONCAT91(CONCAT81(auVar44._4_8_,uStack_85),(char)((ulong)uVar149 >> 0x10));
  auVar34._2_10_ = Var25;
  auVar34[1] = uStack_86;
  auVar34[0] = (char)(uVar2 >> 0x10);
  auVar33._2_12_ = auVar34;
  auVar33[1] = uStack_87;
  auVar33[0] = (char)((ulong)uVar68 >> 0x10);
  uVar168 = CONCAT11((char)(uVar1 >> 0x18),uVar91);
  uVar169 = CONCAT13((char)((ulong)uVar68 >> 0x18),CONCAT12(uVar165,uVar168));
  uVar170 = CONCAT15((char)(uVar2 >> 0x18),CONCAT14(uVar197,uVar169));
  uVar171 = CONCAT17((char)((ulong)uVar149 >> 0x18),CONCAT16(uVar166,uVar170));
  auVar172._0_10_ = CONCAT19(uVar115,CONCAT18(uVar167,uVar171));
  auVar172[10] = uVar206;
  auVar172[0xb] = uVar92;
  auVar173[0xc] = uVar207;
  auVar173._0_12_ = auVar172;
  auVar173[0xd] = uVar145;
  auVar174[0xe] = uVar227;
  auVar174._0_14_ = auVar173;
  auVar174[0xf] = uVar93;
  auVar219._0_14_ = auVar19._0_14_;
  auVar219[0xe] = (char)((uint)uStack_74 >> 0x18);
  auVar219[0xf] = local_68._7_1_;
  auVar218._14_2_ = auVar219._14_2_;
  auVar218._0_13_ = auVar19._0_13_;
  auVar218[0xd] = local_68._6_1_;
  auVar217._13_3_ = auVar218._13_3_;
  auVar217._0_12_ = auVar19._0_12_;
  auVar217[0xc] = (char)((uint)uStack_74 >> 0x10);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._0_11_ = auVar19._0_11_;
  auVar216[0xb] = local_68._5_1_;
  auVar215._11_5_ = auVar216._11_5_;
  auVar215._0_10_ = auVar19._0_10_;
  auVar215[10] = (char)((uint)uStack_74 >> 8);
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._0_9_ = auVar19._0_9_;
  auVar214[9] = local_68._4_1_;
  auVar213._9_7_ = auVar214._9_7_;
  auVar213[8] = (char)uStack_74;
  auVar213._0_8_ = CONCAT44(uStack_74,local_78);
  Var27 = CONCAT91(CONCAT81(auVar213._8_8_,local_68._3_1_),(char)((uint)local_78 >> 0x18));
  auVar36._2_10_ = Var27;
  auVar36[1] = local_68._2_1_;
  auVar36[0] = (char)((uint)local_78 >> 0x10);
  auVar35._2_12_ = auVar36;
  auVar35[1] = local_68._1_1_;
  auVar35[0] = (char)((uint)local_78 >> 8);
  auVar212._0_2_ = CONCAT11((undefined1)local_68,(char)local_78);
  auVar212._2_14_ = auVar35;
  uVar94 = CONCAT11((undefined1)uStack_60,(char)uStack_70);
  uVar95 = CONCAT13(uStack_60._1_1_,CONCAT12((char)((ulong)uStack_70 >> 8),uVar94));
  uVar96 = CONCAT15(uStack_60._2_1_,CONCAT14((char)((ulong)uStack_70 >> 0x10),uVar95));
  uVar68 = CONCAT17(uStack_60._3_1_,CONCAT16((char)((ulong)uStack_70 >> 0x18),uVar96));
  auVar98._0_10_ = CONCAT19(uStack_60._4_1_,CONCAT18((char)((ulong)uStack_70 >> 0x20),uVar68));
  auVar98[10] = (char)((ulong)uStack_70 >> 0x28);
  auVar98[0xb] = uStack_60._5_1_;
  auVar100[0xc] = (char)((ulong)uStack_70 >> 0x30);
  auVar100._0_12_ = auVar98;
  auVar100[0xd] = uStack_60._6_1_;
  auVar111[0xe] = (char)((ulong)uStack_70 >> 0x38);
  auVar111._0_14_ = auVar100;
  auVar111[0xf] = uStack_60._7_1_;
  auVar191._0_14_ = auVar20._0_14_;
  auVar191[0xe] = (char)((uint)uStack_54 >> 0x18);
  auVar191[0xf] = uStack_41;
  auVar190._14_2_ = auVar191._14_2_;
  auVar190._0_13_ = auVar20._0_13_;
  auVar190[0xd] = uStack_42;
  auVar189._13_3_ = auVar190._13_3_;
  auVar189[0xc] = (char)((uint)uStack_54 >> 0x10);
  auVar189._0_12_ = auVar21;
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._0_11_ = auVar21._0_11_;
  auVar188[0xb] = uStack_43;
  auVar187._11_5_ = auVar188._11_5_;
  auVar187._0_10_ = auVar21._0_10_;
  auVar187[10] = (char)((uint)uStack_54 >> 8);
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._0_9_ = auVar21._0_9_;
  auVar186[9] = uStack_44;
  auVar185._9_7_ = auVar186._9_7_;
  auVar185[8] = (char)uStack_54;
  auVar185._0_8_ = CONCAT44(uStack_54,local_58);
  Var39 = CONCAT91(CONCAT81(auVar185._8_8_,uStack_45),(char)((uint)local_58 >> 0x18));
  auVar38._2_10_ = Var39;
  auVar38[1] = uStack_46;
  auVar38[0] = (char)((uint)local_58 >> 0x10);
  auVar37._2_12_ = auVar38;
  auVar37[1] = uStack_47;
  auVar37[0] = (char)((uint)local_58 >> 8);
  uVar146 = CONCAT11((undefined1)uStack_40,(char)uStack_50);
  uVar147 = CONCAT13(uStack_40._1_1_,CONCAT12((char)((uint)uStack_50 >> 8),uVar146));
  uVar148 = CONCAT15(uStack_40._2_1_,CONCAT14((char)((uint)uStack_50 >> 0x10),uVar147));
  uVar149 = CONCAT17(uStack_40._3_1_,CONCAT16((char)((uint)uStack_50 >> 0x18),uVar148));
  auVar151._0_10_ = CONCAT19((undefined1)uStack_3c,CONCAT18((char)uStack_4c,uVar149));
  auVar151[10] = (char)((uint)uStack_4c >> 8);
  auVar151[0xb] = uStack_3c._1_1_;
  auVar152[0xc] = (char)((uint)uStack_4c >> 0x10);
  auVar152._0_12_ = auVar151;
  auVar152[0xd] = uStack_3c._2_1_;
  auVar162[0xe] = (char)((uint)uStack_4c >> 0x18);
  auVar162._0_14_ = auVar152;
  auVar162[0xf] = uStack_3c._3_1_;
  auVar143._0_12_ = auVar80._0_12_;
  auVar143._12_2_ = (short)Var23;
  auVar143._14_2_ = (short)Var25;
  auVar142._12_4_ = auVar143._12_4_;
  auVar142._0_10_ = auVar80._0_10_;
  auVar142._10_2_ = auVar34._0_2_;
  auVar141._10_6_ = auVar142._10_6_;
  auVar141._0_8_ = auVar80._0_8_;
  auVar141._8_2_ = auVar32._0_2_;
  auVar40._4_8_ = auVar141._8_8_;
  auVar40._2_2_ = auVar33._0_2_;
  auVar40._0_2_ = auVar31._0_2_;
  uVar67 = CONCAT22(auVar44._4_2_,(short)((unkuint10)Var46 >> 0x10));
  auVar70._0_8_ = CONCAT26(auVar125._10_2_,CONCAT24(auVar82._10_2_,uVar67));
  auVar70._8_2_ = auVar84._12_2_;
  auVar70._10_2_ = auVar47._8_2_;
  auVar87._12_2_ = auVar85._14_2_;
  auVar87._0_12_ = auVar70;
  auVar87._14_2_ = auVar127._14_2_;
  auVar133._12_2_ = (short)((ulong)uVar52 >> 0x30);
  auVar133._0_12_ = auVar54;
  auVar133._14_2_ = (short)((ulong)uVar171 >> 0x30);
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._10_2_ = (short)((uint6)uVar170 >> 0x20);
  auVar132._0_10_ = auVar54._0_10_;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._8_2_ = (short)((uint6)uVar51 >> 0x20);
  auVar131._0_8_ = uVar52;
  auVar130._8_8_ = auVar131._8_8_;
  auVar130._6_2_ = (short)((uint)uVar169 >> 0x10);
  auVar130._0_6_ = uVar51;
  auVar129._6_10_ = auVar130._6_10_;
  auVar129._4_2_ = (short)((uint)uVar50 >> 0x10);
  auVar129._0_4_ = uVar50;
  uVar50 = CONCAT22((short)((unkuint10)auVar172._0_10_ >> 0x40),
                    (short)((unkuint10)auVar54._0_10_ >> 0x40));
  auVar55._0_8_ = CONCAT26(auVar172._10_2_,CONCAT24(auVar54._10_2_,uVar50));
  auVar55._8_2_ = auVar56._12_2_;
  auVar55._10_2_ = auVar173._12_2_;
  auVar66._12_2_ = auVar65._14_2_;
  auVar66._0_12_ = auVar55;
  auVar66._14_2_ = auVar174._14_2_;
  auVar177._0_12_ = auVar212._0_12_;
  auVar177._12_2_ = (short)Var27;
  auVar177._14_2_ = (short)Var39;
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._0_10_ = auVar212._0_10_;
  auVar176._10_2_ = auVar38._0_2_;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._0_8_ = auVar212._0_8_;
  auVar175._8_2_ = auVar36._0_2_;
  auVar41._4_8_ = auVar175._8_8_;
  auVar41._2_2_ = auVar37._0_2_;
  auVar41._0_2_ = auVar35._0_2_;
  uVar169 = CONCAT22(auVar185._8_2_,auVar213._8_2_);
  auVar208._0_8_ = CONCAT26(auVar187._10_2_,CONCAT24(auVar215._10_2_,uVar169));
  auVar208._8_2_ = auVar217._12_2_;
  auVar208._10_2_ = auVar189._12_2_;
  auVar220._12_2_ = auVar218._14_2_;
  auVar220._0_12_ = auVar208;
  auVar220._14_2_ = auVar190._14_2_;
  auVar196._12_2_ = (short)((ulong)uVar68 >> 0x30);
  auVar196._0_12_ = auVar98;
  auVar196._14_2_ = (short)((ulong)uVar149 >> 0x30);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._10_2_ = (short)((uint6)uVar148 >> 0x20);
  auVar195._0_10_ = auVar98._0_10_;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = (short)((uint6)uVar96 >> 0x20);
  auVar194._0_8_ = uVar68;
  auVar193._8_8_ = auVar194._8_8_;
  auVar193._6_2_ = (short)((uint)uVar147 >> 0x10);
  auVar193._0_6_ = uVar96;
  auVar192._6_10_ = auVar193._6_10_;
  auVar192._4_2_ = (short)((uint)uVar95 >> 0x10);
  auVar192._0_4_ = uVar95;
  uVar95 = CONCAT22((short)((unkuint10)auVar151._0_10_ >> 0x40),
                    (short)((unkuint10)auVar98._0_10_ >> 0x40));
  auVar99._0_8_ = CONCAT26(auVar151._10_2_,CONCAT24(auVar98._10_2_,uVar95));
  auVar99._8_2_ = auVar100._12_2_;
  auVar99._10_2_ = auVar152._12_2_;
  auVar112._12_2_ = auVar111._14_2_;
  auVar112._0_12_ = auVar99;
  auVar112._14_2_ = auVar162._14_2_;
  *(ulong *)(s + -4) =
       CONCAT44(CONCAT22(CONCAT11(local_48,(char)local_58),auVar212._0_2_),
                CONCAT22(CONCAT11(local_88,(char)(uVar1 >> 0x10)),auVar80._0_2_));
  *(ulong *)(s + lVar49 + -4) = CONCAT44(auVar41._0_4_,auVar40._0_4_);
  *(ulong *)(s + lVar49 * 2 + -4) = CONCAT44(auVar175._8_4_,auVar141._8_4_);
  uVar68 = CONCAT44(auVar176._12_4_,auVar142._12_4_);
  *(undefined8 *)(s + lVar13 + -4) = uVar68;
  *(ulong *)(s + lVar49 * 4 + -4) = CONCAT44(uVar169,uVar67);
  *(ulong *)(s + lVar14 + -4) =
       CONCAT44((int)((ulong)auVar208._0_8_ >> 0x20),(int)((ulong)auVar70._0_8_ >> 0x20));
  *(ulong *)(s + lVar16 + -4) = CONCAT44(auVar208._8_4_,auVar70._8_4_);
  *(ulong *)(s + lVar15 + -4) = CONCAT44(auVar220._12_4_,auVar87._12_4_);
  *(ulong *)(s + lVar49 * 8 + -4) =
       CONCAT44(CONCAT22(uVar146,uVar94),CONCAT22(uVar168,(short)uVar5));
  *(ulong *)(s + lVar49 * 9 + -4) = CONCAT44(auVar192._4_4_,auVar129._4_4_);
  *(ulong *)(s + lVar49 * 10 + -4) = CONCAT44(auVar194._8_4_,auVar131._8_4_);
  uVar68 = CONCAT44(auVar195._12_4_,auVar132._12_4_);
  *(undefined8 *)(s + lVar49 * 0xb + -4) = uVar68;
  *(ulong *)(s + lVar49 * 0xc + -4) = CONCAT44(uVar95,uVar50);
  *(ulong *)(s + lVar49 * 0xd + -4) =
       CONCAT44((int)((ulong)auVar99._0_8_ >> 0x20),(int)((ulong)auVar55._0_8_ >> 0x20));
  *(ulong *)(s + lVar49 * 0xe + -4) = CONCAT44(auVar99._8_4_,auVar55._8_4_);
  *(ulong *)(s + lVar49 * 0xf + -4) = CONCAT44(auVar112._12_4_,auVar66._12_4_);
  return;
}

Assistant:

void aom_lpf_vertical_4_quad_sse2(uint8_t *s, int pitch,
                                  const uint8_t *_blimit0,
                                  const uint8_t *_limit0,
                                  const uint8_t *_thresh0) {
  DECLARE_ALIGNED(16, unsigned char, t_dst[16 * 8]);

  // Transpose 16x8
  transpose_16x8(s - 4, s - 4 + pitch * 8, pitch, t_dst, 16);

  // Loop filtering
  aom_lpf_horizontal_4_quad_sse2(t_dst + 4 * 16, 16, _blimit0, _limit0,
                                 _thresh0);

  // Transpose back
  transpose_16x8_to_8x16(t_dst, 16, s - 4, pitch);
}